

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adiak.c
# Opt level: O0

int adiak_clustername(void)

{
  int iVar1;
  char *local_428;
  char *c;
  int i;
  int result;
  char clustername [512];
  char hostname [512];
  int local_c;
  
  c._0_4_ = 0;
  memset(clustername + 0x1f8,0,0x200);
  memset(&i,0,0x200);
  iVar1 = adksys_hostname(clustername + 0x1f8,0x200);
  if (iVar1 == -1) {
    local_c = -1;
  }
  else {
    for (local_428 = clustername + 0x1f8; *local_428 != '\0'; local_428 = local_428 + 1) {
      if ((*local_428 < '0') || ('9' < *local_428)) {
        if (*local_428 == '.') break;
        *(char *)((long)&i + (long)(int)c) = *local_428;
        c._0_4_ = (int)c + 1;
      }
    }
    *(undefined1 *)((long)&i + (long)(int)c) = 0;
    local_c = adiak_namevalue("cluster",2,"host","%s",&i);
  }
  return local_c;
}

Assistant:

int adiak_clustername()
{
   char hostname[512];
   char clustername[512];
   int result;
   int i = 0;
   char *c;

   memset(hostname, 0, sizeof(hostname));
   memset(clustername, 0, sizeof(hostname));
   result = adksys_hostname(hostname, sizeof(hostname));
   if (result == -1)
      return -1;

   for (c = hostname; *c; c++) {
      if (*c >= '0' && *c <= '9')
         continue;
      if (*c == '.')
         break;
      clustername[i++] = *c;
   }
   clustername[i] = '\0';

   return adiak_namevalue("cluster", adiak_general, "host", "%s", clustername);
}